

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_binary_packed_decoder.cpp
# Opt level: O1

void __thiscall
duckdb::DeltaBinaryPackedDecoder::Read
          (DeltaBinaryPackedDecoder *this,uint8_t *defines,idx_t read_count,Vector *result,
          idx_t result_offset)

{
  type tVar1;
  ColumnReader *pCVar2;
  Allocator *allocator;
  ResizeableBuffer *this_00;
  pointer pDVar3;
  runtime_error *this_01;
  idx_t batch_size;
  idx_t iVar4;
  
  pCVar2 = this->reader;
  batch_size = read_count;
  if (defines != (uint8_t *)0x0) {
    if (result_offset < result_offset + read_count) {
      iVar4 = 0;
      batch_size = 0;
      do {
        batch_size = batch_size +
                     (pCVar2->column_schema->max_define == (ulong)defines[iVar4 + result_offset]);
        iVar4 = iVar4 + 1;
      } while (read_count != iVar4);
    }
    else {
      batch_size = 0;
    }
  }
  allocator = pCVar2->reader->allocator;
  this_00 = this->decoded_data_buffer;
  iVar4 = this_00->alloc_len;
  (this_00->super_ByteBuffer).ptr = *(data_ptr_t *)&this_00->field_0x18;
  (this_00->super_ByteBuffer).len = iVar4;
  tVar1 = pCVar2->column_schema->parquet_type;
  if (tVar1 == INT64) {
    ResizeableBuffer::resize(this_00,allocator,batch_size * 8);
    pDVar3 = unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::
             operator->(&this->dbp_decoder);
    DbpDecoder::GetBatch<long>(pDVar3,(this->decoded_data_buffer->super_ByteBuffer).ptr,batch_size);
  }
  else {
    if (tVar1 != INT32) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"DELTA_BINARY_PACKED should only be INT32 or INT64")
      ;
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ResizeableBuffer::resize(this_00,allocator,batch_size * 4);
    pDVar3 = unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::
             operator->(&this->dbp_decoder);
    DbpDecoder::GetBatch<int>(pDVar3,(this->decoded_data_buffer->super_ByteBuffer).ptr,batch_size);
  }
  (*this->reader->_vptr_ColumnReader[0xe])
            (this->reader,this->decoded_data_buffer,defines,read_count,result_offset,result);
  return;
}

Assistant:

void DeltaBinaryPackedDecoder::Read(uint8_t *defines, idx_t read_count, Vector &result, idx_t result_offset) {
	idx_t valid_count = reader.GetValidCount(defines, read_count, result_offset);

	auto &allocator = reader.reader.allocator;
	decoded_data_buffer.reset();
	switch (reader.Schema().parquet_type) {
	case duckdb_parquet::Type::INT32:
		decoded_data_buffer.resize(allocator, sizeof(int32_t) * (valid_count));
		dbp_decoder->GetBatch<int32_t>(decoded_data_buffer.ptr, valid_count);
		break;
	case duckdb_parquet::Type::INT64:
		decoded_data_buffer.resize(allocator, sizeof(int64_t) * (valid_count));
		dbp_decoder->GetBatch<int64_t>(decoded_data_buffer.ptr, valid_count);
		break;

	default:
		throw std::runtime_error("DELTA_BINARY_PACKED should only be INT32 or INT64");
	}
	// Plain() will put NULLs in the right place
	reader.Plain(decoded_data_buffer, defines, read_count, result_offset, result);
}